

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManAddFanin(Bbl_Man_t *p,int ObjId,int FaninId)

{
  int iVar1;
  Bbl_Obj_t *pObj_00;
  Bbl_Obj_t *pObj_01;
  int iFanin;
  Bbl_Obj_t *pFanin;
  Bbl_Obj_t *pObj;
  int FaninId_local;
  int ObjId_local;
  Bbl_Man_t *p_local;
  
  pObj_00 = Bbl_ManObj(p,ObjId);
  iVar1 = Bbl_ObjIsCi(pObj_00);
  if (iVar1 == 0) {
    pObj_01 = Bbl_ManObj(p,FaninId);
    iVar1 = Bbl_ObjIsCo(pObj_01);
    if (iVar1 == 0) {
      iVar1 = Vec_IntEntry(p->vFaninNums,ObjId);
      if (iVar1 < (int)(*(uint *)&pObj_00->field_0x8 >> 4)) {
        if ((int)(*(uint *)&pObj_00->field_0x8 >> 4) <= iVar1) {
          __assert_fail("iFanin < (int)pObj->nFanins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                        ,0x415,"void Bbl_ManAddFanin(Bbl_Man_t *, int, int)");
        }
        Vec_IntWriteEntry(p->vFaninNums,ObjId,iVar1 + 1);
        (&pObj_00[1].Id)[iVar1] = (int)pObj_00 - (int)pObj_01;
      }
      else {
        printf("Bbl_ManAddFanin(): Trying to add more fanins to object (Id = %d) than declared (%d).\n"
               ,(ulong)(uint)ObjId,(ulong)(*(uint *)&pObj_00->field_0x8 >> 4));
      }
    }
    else {
      printf("Bbl_ManAddFanin(): Cannot add fanout of the combinational output (Id = %d).\n",
             (ulong)(uint)FaninId);
    }
  }
  else {
    printf("Bbl_ManAddFanin(): Cannot add fanin of the combinational input (Id = %d).\n",
           (ulong)(uint)ObjId);
  }
  return;
}

Assistant:

void Bbl_ManAddFanin( Bbl_Man_t * p, int ObjId, int FaninId )
{
    Bbl_Obj_t * pObj, * pFanin;
    int iFanin;
    pObj   = Bbl_ManObj( p, ObjId );
    if ( Bbl_ObjIsCi(pObj) )
    {
        printf( "Bbl_ManAddFanin(): Cannot add fanin of the combinational input (Id = %d).\n", ObjId );
        return;
    }
    pFanin = Bbl_ManObj( p, FaninId );
    if ( Bbl_ObjIsCo(pFanin) )
    {
        printf( "Bbl_ManAddFanin(): Cannot add fanout of the combinational output (Id = %d).\n", FaninId );
        return;
    }
    iFanin = Vec_IntEntry( p->vFaninNums, ObjId );
    if ( iFanin >= (int)pObj->nFanins )
    {
        printf( "Bbl_ManAddFanin(): Trying to add more fanins to object (Id = %d) than declared (%d).\n", ObjId, pObj->nFanins );
        return;
    }
    assert( iFanin < (int)pObj->nFanins );
    Vec_IntWriteEntry( p->vFaninNums, ObjId, iFanin+1 );
    pObj->pFanins[iFanin] = (char *)pObj - (char *)pFanin;
}